

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering,_8UL>::
         Construct(DB *db,LIST *params)

{
  IfcSurfaceStyleRendering *in;
  
  in = (IfcSurfaceStyleRendering *)operator_new(0x100);
  *(undefined8 *)&in->field_0xf0 = 0;
  *(char **)&in->field_0xf8 = "IfcSurfaceStyleRendering";
  *(undefined8 *)
   &(in->super_IfcSurfaceStyleShading).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x20 = 0;
  (in->super_IfcSurfaceStyleShading).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)
   &(in->super_IfcSurfaceStyleShading).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x10 = 0;
  (in->super_IfcSurfaceStyleShading).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcSurfaceStyleRendering_00898bc0;
  *(undefined ***)&in->field_0xe8 = &PTR__IfcSurfaceStyleRendering_00898c10;
  *(undefined ***)
   &(in->super_IfcSurfaceStyleShading).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x18 =
       &PTR__IfcSurfaceStyleRendering_00898be8;
  in->field_0x30 = 0;
  (in->DiffuseColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in->DiffuseColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (in->DiffuseColour).have = false;
  (in->TransmissionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in->TransmissionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (in->TransmissionColour).have = false;
  (in->DiffuseTransmissionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in->DiffuseTransmissionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (in->DiffuseTransmissionColour).have = false;
  (in->ReflectionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in->ReflectionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (in->ReflectionColour).have = false;
  (in->SpecularColour).have = false;
  (in->SpecularColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in->SpecularColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (in->SpecularHighlight).have = false;
  (in->SpecularHighlight).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in->SpecularHighlight).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (in->ReflectanceMethod)._M_dataplus._M_p = (pointer)&(in->ReflectanceMethod).field_2;
  (in->ReflectanceMethod)._M_string_length = 0;
  (in->ReflectanceMethod).field_2._M_local_buf[0] = '\0';
  GenericFill<Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcSurfaceStyleShading).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcSurfaceStyleShading).
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }